

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

longdouble * __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::min(quadratic_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  ulong uVar2;
  longdouble *plVar3;
  long lVar4;
  longdouble *plVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  
  lVar8 = _DAT_0062c7d0;
  if (n != 0) {
    lVar4 = 0;
    do {
      lVar1 = *(longdouble *)
               ((long)(this->linear_elements)._M_t.
                      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                      super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar4);
      lVar6 = ABS(lVar1);
      lVar7 = lVar8;
      if (lVar6 <= lVar8 || lVar8 != lVar6) {
        lVar7 = lVar6;
      }
      if ((longdouble)0 != lVar1) {
        lVar8 = lVar7;
      }
      if (NAN((longdouble)0) || NAN(lVar1)) {
        lVar8 = lVar7;
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar4);
  }
  uVar2 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar2 == 0) {
    plVar3 = (longdouble *)0x0;
  }
  else {
    plVar3 = (longdouble *)(uVar2 << 5);
    plVar5 = (longdouble *)0x0;
    do {
      lVar1 = *(longdouble *)
               ((long)&((this->quadratic_elements)._M_t.
                        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                        .
                        super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                       ._M_head_impl)->factor + (long)plVar5);
      lVar6 = ABS(lVar1);
      lVar7 = lVar8;
      if (lVar6 <= lVar8 || lVar8 != lVar6) {
        lVar7 = lVar6;
      }
      if ((longdouble)0 != lVar1) {
        lVar8 = lVar7;
      }
      if (NAN((longdouble)0) || NAN(lVar1)) {
        lVar8 = lVar7;
      }
      plVar5 = plVar5 + 2;
    } while (plVar3 != plVar5);
  }
  return plVar3;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }